

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
::sparse_hashtable(sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                   *this,MoveDontCopyT mover,
                  sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                  *ht,size_type min_buckets_wanted)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  size_type sVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  undefined1 local_29;
  
  sVar4 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_threshold_;
  uVar1 = *(undefined4 *)
           ((long)&(ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.
                   enlarge_threshold_ + 4);
  sVar5 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_threshold_;
  uVar2 = *(undefined4 *)
           ((long)&(ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.
                   shrink_threshold_ + 4);
  fVar11 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_factor_;
  bVar6 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.consider_shrink_;
  bVar7 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_empty_;
  bVar8 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_deleted_;
  uVar9 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.field_0x1b;
  uVar3 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_factor_ = fVar11;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.consider_shrink_ = bVar6;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_empty_ = bVar7;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_deleted_ = bVar8;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.field_0x1b = uVar9;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.num_ht_copies_ = uVar3;
  *(int *)&(this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.
           enlarge_threshold_ = (int)sVar4;
  *(undefined4 *)
   ((long)&(this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.
           enlarge_threshold_ + 4) = uVar1;
  *(int *)&(this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.
           shrink_threshold_ = (int)sVar5;
  *(undefined4 *)
   ((long)&(this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.
           shrink_threshold_ + 4) = uVar2;
  (this->key_info).delkey._i = 0;
  (this->key_info).delkey._i = (ht->key_info).delkey._i;
  A::copy_ctor = A::copy_ctor + 1;
  this->num_deleted = 0;
  sparsetable<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::sparsetable(&this->table,0,&local_29);
  fVar11 = (float)(this->table).settings.table_size;
  fVar12 = (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_factor_
           * fVar11;
  uVar10 = (ulong)fVar12;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_threshold_ =
       (long)(fVar12 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10;
  fVar11 = fVar11 * (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.
                    shrink_factor_;
  uVar10 = (ulong)fVar11;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_threshold_ =
       (long)(fVar11 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.consider_shrink_ = false;
  move_from(this,mover,ht,min_buckets_wanted);
  return;
}

Assistant:

sparse_hashtable(MoveDontCopyT mover, sparse_hashtable& ht,
                   size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        table(0, ht.get_allocator()) {
    settings.reset_thresholds(bucket_count());
    move_from(mover, ht, min_buckets_wanted);  // ignores deleted entries
  }